

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3)

{
  CBNode **ppCVar1;
  ZoneHeap *this_00;
  uint32_t uVar2;
  Zone *pZVar3;
  anon_union_8_2_78723da6_for_MemData_2 aVar4;
  ushort uVar5;
  Error EVar6;
  int iVar7;
  CBNode *node;
  void **ppvVar8;
  undefined4 extraout_var;
  char *pcVar9;
  uint8_t uVar10;
  uint count;
  ushort uVar11;
  ulong uVar12;
  CBNode **ppCVar13;
  uint uVar14;
  Detail instDetail;
  Operand opArray [4];
  StringBuilderTmp<256UL> sb;
  Detail local_1a8;
  anon_union_16_7_ed616b9d_for_Operand__0 local_198;
  UInt64 local_188;
  anon_union_8_2_78723da6_for_MemData_2 aStack_180;
  UInt64 local_178;
  anon_union_8_2_78723da6_for_MemData_2 aStack_170;
  UInt64 local_168;
  anon_union_8_2_78723da6_for_MemData_2 aStack_160;
  StringBuilder local_158;
  CBLabel local_138 [4];
  
  pcVar9 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment;
  uVar14 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._globalOptions |
           (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options;
  count = ((((uint)((undefined1  [16])((undefined1  [16])o1->field_0 & (undefined1  [16])0x7) !=
                   (undefined1  [16])0x0) -
            (uint)((undefined1  [16])((undefined1  [16])o0->field_0 & (undefined1  [16])0x7) ==
                  (undefined1  [16])0x0)) -
           (uint)((undefined1  [16])((undefined1  [16])o2->field_0 & (undefined1  [16])0x7) ==
                 (undefined1  [16])0x0)) + 3) -
          (uint)((undefined1  [16])((undefined1  [16])o3->field_0 & (undefined1  [16])0x7) ==
                (undefined1  [16])0x0);
  if ((uVar14 & 3) == 0) goto LAB_0016e692;
  EVar6 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._lastError;
  if (EVar6 != 0) {
    return EVar6;
  }
  if ((uVar14 & 2) == 0) goto LAB_0016e692;
  local_198._packed[0].field_10 = (o0->field_0)._packed[0];
  local_198._mem.field_2 = (o0->field_0)._mem.field_2;
  local_188 = (o1->field_0)._packed[0];
  aStack_180 = (o1->field_0)._mem.field_2;
  local_178 = (o2->field_0)._packed[0];
  aStack_170 = (o2->field_0)._mem.field_2;
  local_168 = (o3->field_0)._packed[0];
  aStack_160 = (o3->field_0)._mem.field_2;
  local_1a8.extraReg = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
  local_1a8.instId = instId;
  local_1a8.options = uVar14;
  EVar6 = Inst::validate((uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter.
                               _codeInfo._archInfo.field_0.field_0._type,&local_1a8,
                         (Operand_ *)&local_198._any,count);
  if (EVar6 != 0) {
    local_158._data = (char *)local_138;
    local_138[0].super_CBNode._prev._0_1_ = 0;
    local_158._length = 0;
    local_158._capacity = 0x100;
    local_158._canFree = 0;
    pcVar9 = DebugUtils::errorAsString(EVar6);
    StringBuilder::_opString(&local_158,1,pcVar9,0xffffffffffffffff);
    StringBuilder::_opString(&local_158,1,": ",0xffffffffffffffff);
    Logging::formatInstruction
              (&local_158,0,(CodeEmitter *)this,
               (uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._codeInfo.
                     _archInfo.field_0.field_0._type,&local_1a8,(Operand_ *)&local_198._any,count);
    EVar6 = CodeEmitter::setLastError((CodeEmitter *)this,EVar6,local_158._data);
    StringBuilder::~StringBuilder(&local_158);
    return EVar6;
  }
  do {
    uVar14 = uVar14 & 0xfffffffd;
LAB_0016e692:
    (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options = 0;
    (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment = (char *)0x0;
    this_00 = &(this->super_CodeCompiler).super_CodeBuilder._cbHeap;
    pZVar3 = (this->super_CodeCompiler).super_CodeBuilder._cbHeap._zone;
    if (instId - 0x113 < 0x20 || instId - 0x176 < 3) {
      if (pZVar3 != (Zone *)0x0) {
        node = (CBNode *)ZoneHeap::_alloc(this_00,(ulong)(count * 0x10 + 0x58),(size_t *)&local_158)
        ;
        if (node == (CBNode *)0x0) goto LAB_0016eb1a;
        ppCVar1 = &node[2]._next;
        if (count != 0) {
          aVar4 = (o0->field_0)._mem.field_2;
          *ppCVar1 = (CBNode *)(o0->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[2]._type = aVar4;
          if (count != 1) {
            aVar4 = (o1->field_0)._mem.field_2;
            node[2]._inlineComment = (char *)(o1->field_0)._packed[0];
            node[2]._passData = (void *)aVar4;
            if (2 < count) {
              aVar4 = (o2->field_0)._mem.field_2;
              node[3]._prev = (CBNode *)(o2->field_0)._packed[0];
              node[3]._next = (CBNode *)aVar4;
              if (count != 3) {
                aVar4 = (o3->field_0)._mem.field_2;
                *(UInt64 *)&node[3]._type = (o3->field_0)._packed[0];
                node[3]._inlineComment = (char *)aVar4;
              }
            }
          }
        }
        node->_prev = (CBNode *)0x0;
        node->_next = (CBNode *)0x0;
        node->_type = '\x01';
        uVar2 = (this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
        node->_position = (this->super_CodeCompiler).super_CodeBuilder._position;
        uVar5 = (ushort)uVar2 | 4;
        uVar10 = 0xff;
        node->_inlineComment = (char *)0x0;
        node->_passData = (void *)0x0;
        node[1]._prev = (CBNode *)0x0;
        node[1]._next = (CBNode *)0x0;
        node->_flags = uVar5;
        *(uint32_t *)&node[1]._prev = instId;
        *(uint *)((long)&node[1]._prev + 4) = uVar14;
        node->_opCount = (uint8_t)count;
        node[1]._inlineComment = (char *)ppCVar1;
        if (count == 0) goto LAB_0016e8bd;
        uVar12 = 0;
        ppCVar13 = ppCVar1;
        goto LAB_0016e7a7;
      }
      _emit();
    }
    else if (pZVar3 != (Zone *)0x0) break;
    _emit();
  } while( true );
  node = (CBNode *)ZoneHeap::_alloc(this_00,(ulong)(count * 0x10 + 0x48),(size_t *)&local_158);
  if (node == (CBNode *)0x0) {
LAB_0016eb1a:
    EVar6 = 1;
LAB_0016e911:
    EVar6 = CodeEmitter::setLastError((CodeEmitter *)this,EVar6,(char *)0x0);
    return EVar6;
  }
  ppvVar8 = &node[1]._passData;
  if (count != 0) {
    aVar4 = (o0->field_0)._mem.field_2;
    *ppvVar8 = (void *)(o0->field_0)._packed[0];
    node[2]._prev = (CBNode *)aVar4;
    if (count != 1) {
      aVar4 = (o1->field_0)._mem.field_2;
      node[2]._next = (CBNode *)(o1->field_0)._packed[0];
      *(anon_union_8_2_78723da6_for_MemData_2 *)&node[2]._type = aVar4;
      if (2 < count) {
        aVar4 = (o2->field_0)._mem.field_2;
        node[2]._inlineComment = (char *)(o2->field_0)._packed[0];
        node[2]._passData = (void *)aVar4;
        if (count != 3) {
          aVar4 = (o3->field_0)._mem.field_2;
          node[3]._prev = (CBNode *)(o3->field_0)._packed[0];
          node[3]._next = (CBNode *)aVar4;
        }
      }
    }
  }
  node->_prev = (CBNode *)0x0;
  node->_next = (CBNode *)0x0;
  node->_type = '\x01';
  uVar2 = (this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
  node->_position = (this->super_CodeCompiler).super_CodeBuilder._position;
  *(undefined1 (*) [32])&node->_inlineComment = ZEXT432(0) << 0x40;
  node->_flags = (ushort)uVar2 | 4;
  *(uint32_t *)&node[1]._prev = instId & 0xffff;
  uVar10 = 0xff;
  *(uint *)((long)&node[1]._prev + 4) = uVar14;
  node->_opCount = (uint8_t)count;
  node[1]._inlineComment = (char *)ppvVar8;
  if (count != 0) {
    uVar12 = 0;
    do {
      if (((ulong)*ppvVar8 & 7) == 2) {
        uVar10 = (uint8_t)uVar12;
        break;
      }
      uVar12 = uVar12 + 1;
      ppvVar8 = ppvVar8 + 2;
    } while (count != uVar12);
  }
  node[1]._type = uVar10;
  node[1]._next = (CBNode *)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg
  ;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
  goto LAB_0016e9b4;
  while( true ) {
    uVar12 = uVar12 + 1;
    ppCVar13 = ppCVar13 + 2;
    if (count == uVar12) break;
LAB_0016e7a7:
    if (((ulong)*ppCVar13 & 7) == 2) {
      uVar10 = (uint8_t)uVar12;
      break;
    }
  }
LAB_0016e8bd:
  node[1]._type = uVar10;
  node[1]._passData = (void *)0x0;
  node[2]._prev = (CBNode *)0x0;
  node[1]._next = (CBNode *)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg
  ;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
  local_158._data = (char *)0x0;
  if ((uVar14 & 0x10) == 0) {
    if (((ulong)*ppCVar1 & 7) == 4) {
      EVar6 = CodeBuilder::getCBLabel
                        ((CodeBuilder *)this,(CBLabel **)&local_158,
                         *(uint32_t *)((long)&node[2]._next + 4));
      if (EVar6 != 0) goto LAB_0016e911;
      uVar5 = node->_flags;
    }
    else {
      uVar14 = uVar14 | 0x10;
    }
  }
  *(uint *)((long)&node[1]._prev + 4) = uVar14;
  uVar11 = 0x50;
  if (instId != 0x11e) {
    uVar11 = 0x20;
  }
  node->_flags = uVar5 | uVar11;
  node[1]._passData = local_158._data;
  node[2]._prev = (CBNode *)0x0;
  if (local_158._data != (char *)0x0) {
    node[2]._prev = *(CBNode **)(local_158._data + 0x30);
    *(CBNode **)(local_158._data + 0x30) = node;
    *(int *)(local_158._data + 0x2c) = *(int *)(local_158._data + 0x2c) + 1;
  }
  if ((instId == 0x11e) || ((uVar14 & 0x100) != 0)) {
    node->_flags = uVar5 | uVar11 | 0x40;
  }
LAB_0016e9b4:
  if (pcVar9 != (char *)0x0) {
    strlen(pcVar9);
    iVar7 = Zone::dup(&(this->super_CodeCompiler).super_CodeBuilder._cbDataZone,(int)pcVar9);
    node->_inlineComment = (char *)CONCAT44(extraout_var,iVar7);
  }
  CodeBuilder::addNode((CodeBuilder *)this,node);
  return 0;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter is in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3)
      };

      Inst::Detail instDetail(instId, options, _extraReg);
      Error err = Inst::validate(getArchType(), instDetail, opArray, opCount);

      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instDetail, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}